

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpmemoryobject.h
# Opt level: O2

void __thiscall jrtplib::RTCPSDESInfo::RTCPSDESInfo(RTCPSDESInfo *this,RTPMemoryManager *mgr)

{
  undefined8 *puVar1;
  long lVar2;
  
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTCPSDESInfo_001459c0;
  lVar2 = 0x20;
  do {
    *(undefined8 *)((long)this->nonprivateitems + lVar2 + -0x18) = 0;
    *(undefined ***)((long)(this->nonprivateitems + -1) + lVar2) = &PTR__SDESItem_001459e0;
    puVar1 = (undefined8 *)((long)this->nonprivateitems + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x100);
  (this->privitems).
  super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->privitems;
  (this->privitems).
  super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->privitems;
  (this->privitems).
  super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->curitem)._M_node = (_List_node_base *)0x0;
  for (lVar2 = 0x18; lVar2 != 0xf8; lVar2 = lVar2 + 0x20) {
    *(RTPMemoryManager **)((long)this->nonprivateitems + lVar2 + -0x10) = mgr;
  }
  return;
}

Assistant:

RTPMemoryObject(RTPMemoryManager *memmgr) : mgr(memmgr)			{ }